

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCore.c
# Opt level: O0

int Lpk_ResynthesizeNode(Lpk_Man_t *p)

{
  int iVar1;
  uint uVar2;
  abctime aVar3;
  abctime aVar4;
  Lpk_Cut_t *pCut_00;
  Abc_Obj_t *pAVar5;
  uint *pTruth_00;
  Kit_DsdNtk_t *pNtk;
  Kit_DsdObj_t *pKVar6;
  abctime clk;
  int RetValue;
  int nCutNodes;
  int nSuppSize;
  int k;
  int i;
  uint *pTruth;
  Lpk_Cut_t *pCut;
  Kit_DsdNtk_t *pDsdNtk;
  Lpk_Man_t *p_local;
  
  aVar3 = Abc_Clock();
  iVar1 = Lpk_NodeCuts(p);
  if (iVar1 == 0) {
    aVar4 = Abc_Clock();
    p->timeCuts = (aVar4 - aVar3) + p->timeCuts;
    p_local._4_4_ = 0;
  }
  else {
    aVar4 = Abc_Clock();
    p->timeCuts = (aVar4 - aVar3) + p->timeCuts;
    if (p->pPars->fVeryVerbose != 0) {
      printf("Node %5d : Mffc size = %5d. Cuts = %5d.\n",(ulong)(uint)p->pObj->Id,
             (ulong)(uint)p->nMffc,(ulong)(uint)p->nEvals);
    }
    p->nCutsTotal = p->nCuts + p->nCutsTotal;
    p->nCutsUseful = p->nEvals + p->nCutsUseful;
    for (nSuppSize = 0;
        (nSuppSize < p->nEvals &&
        ((pCut_00 = p->pCuts + p->pEvals[nSuppSize], p->pPars->fFirst == 0 || (nSuppSize != 1))));
        nSuppSize = nSuppSize + 1) {
      for (nCutNodes = 0; nCutNodes < (int)(*(uint *)pCut_00 & 0x3f); nCutNodes = nCutNodes + 1) {
        pAVar5 = Abc_NtkObj(p->pNtk,pCut_00->pLeaves[nCutNodes]);
        (pAVar5->vFanouts).nSize = (pAVar5->vFanouts).nSize + 1;
      }
      iVar1 = Abc_NodeMffcLabel(p->pObj);
      for (nCutNodes = 0; nCutNodes < (int)(*(uint *)pCut_00 & 0x3f); nCutNodes = nCutNodes + 1) {
        pAVar5 = Abc_NtkObj(p->pNtk,pCut_00->pLeaves[nCutNodes]);
        (pAVar5->vFanouts).nSize = (pAVar5->vFanouts).nSize + -1;
      }
      if (iVar1 == (*(uint *)pCut_00 >> 6 & 0x3f) - (*(uint *)pCut_00 >> 0xc & 0x3f)) {
        aVar3 = Abc_Clock();
        pTruth_00 = Lpk_CutTruth(p,pCut_00,0);
        uVar2 = Extra_TruthSupportSize(pTruth_00,*(uint *)pCut_00 & 0x3f);
        aVar4 = Abc_Clock();
        p->timeTruth = (aVar4 - aVar3) + p->timeTruth;
        pNtk = Kit_DsdDecompose(pTruth_00,*(uint *)pCut_00 & 0x3f);
        pKVar6 = Kit_DsdNtkRoot(pNtk);
        if ((uint)*pKVar6 >> 0x1a == 0x10) {
          Kit_DsdNtkFree(pNtk);
        }
        else {
          iVar1 = Kit_DsdNonDsdSizeMax(pNtk);
          if ((p->pPars->nLutSize < iVar1) &&
             ((int)((((*(uint *)pCut_00 >> 6 & 0x3f) - (*(uint *)pCut_00 >> 0xc & 0x3f)) + -1) *
                    (p->pPars->nLutSize + -1) + 1) <= (int)uVar2)) {
            Kit_DsdNtkFree(pNtk);
          }
          else {
            if (p->pPars->fVeryVerbose != 0) {
              printf("  C%02d: L= %2d/%2d  V= %2d/%d  N= %d  W= %4.2f  ",(double)pCut_00->Weight,
                     (ulong)(uint)nSuppSize,(ulong)(*(uint *)pCut_00 & 0x3f),(ulong)uVar2,
                     (ulong)(*(uint *)pCut_00 >> 6 & 0x3f),(ulong)(*(uint *)pCut_00 >> 0xc & 0x3f),
                     *(uint *)pCut_00 >> 0x12 & 0x3f);
              Kit_DsdPrint(_stdout,pNtk);
              Kit_DsdPrintFromTruth(pTruth_00,*(uint *)pCut_00 & 0x3f);
            }
            aVar3 = Abc_Clock();
            iVar1 = Lpk_ExploreCut(p,pCut_00,pNtk);
            aVar4 = Abc_Clock();
            p->timeEval = (aVar4 - aVar3) + p->timeEval;
            Kit_DsdNtkFree(pNtk);
            if (iVar1 != 0) break;
          }
        }
      }
    }
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Lpk_ResynthesizeNode( Lpk_Man_t * p )
{
//    static int Count = 0;
    Kit_DsdNtk_t * pDsdNtk;
    Lpk_Cut_t * pCut;
    unsigned * pTruth;
    int i, k, nSuppSize, nCutNodes, RetValue;
    abctime clk;

    // compute the cuts
clk = Abc_Clock();
    if ( !Lpk_NodeCuts( p ) )
    {
p->timeCuts += Abc_Clock() - clk;
        return 0;
    }
p->timeCuts += Abc_Clock() - clk;

//return 0;

    if ( p->pPars->fVeryVerbose )
    printf( "Node %5d : Mffc size = %5d. Cuts = %5d.\n", p->pObj->Id, p->nMffc, p->nEvals );
    // try the good cuts
    p->nCutsTotal  += p->nCuts;
    p->nCutsUseful += p->nEvals;
    for ( i = 0; i < p->nEvals; i++ )
    {
        // get the cut
        pCut = p->pCuts + p->pEvals[i];
        if ( p->pPars->fFirst && i == 1 )
            break;

        // skip bad cuts        
//        printf( "Mffc size = %d.  ", Abc_NodeMffcLabel(p->pObj) );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Abc_NtkObj(p->pNtk, pCut->pLeaves[k])->vFanouts.nSize++;
        nCutNodes = Abc_NodeMffcLabel(p->pObj);
//        printf( "Mffc with cut = %d.  ", nCutNodes );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Abc_NtkObj(p->pNtk, pCut->pLeaves[k])->vFanouts.nSize--;
//        printf( "Mffc cut = %d.  ", (int)pCut->nNodes - (int)pCut->nNodesDup );
//        printf( "\n" );
        if ( nCutNodes != (int)pCut->nNodes - (int)pCut->nNodesDup )
            continue;

        // compute the truth table
clk = Abc_Clock();
        pTruth = Lpk_CutTruth( p, pCut, 0 );
        nSuppSize = Extra_TruthSupportSize(pTruth, pCut->nLeaves);
p->timeTruth += Abc_Clock() - clk;

        pDsdNtk = Kit_DsdDecompose( pTruth, pCut->nLeaves ); 
//        Kit_DsdVerify( pDsdNtk, pTruth, pCut->nLeaves ); 
        // skip 16-input non-DSD because ISOP will not work
        if ( Kit_DsdNtkRoot(pDsdNtk)->nFans == 16 ) 
        {
            Kit_DsdNtkFree( pDsdNtk );
            continue;
        }

        // if DSD has nodes that require splitting to fit them into LUTs
        // we can skip those cuts that cannot lead to improvement
        // (a full DSD network requires  V = Nmin * (K-1) + 1 for improvement)
        if ( Kit_DsdNonDsdSizeMax(pDsdNtk) > p->pPars->nLutSize && 
             nSuppSize >= ((int)pCut->nNodes - (int)pCut->nNodesDup - 1) * (p->pPars->nLutSize - 1) + 1 )
        {
            Kit_DsdNtkFree( pDsdNtk );
            continue;
        }

        if ( p->pPars->fVeryVerbose )
        {
//            char * pFileName;
            printf( "  C%02d: L= %2d/%2d  V= %2d/%d  N= %d  W= %4.2f  ", 
                i, pCut->nLeaves, nSuppSize, pCut->nNodes, pCut->nNodesDup, pCut->nLuts, pCut->Weight );
            Kit_DsdPrint( stdout, pDsdNtk );
            Kit_DsdPrintFromTruth( pTruth, pCut->nLeaves );
//            pFileName = Kit_TruthDumpToFile( pTruth, pCut->nLeaves, Count++ );
//            printf( "Saved truth table in file \"%s\".\n", pFileName );
        }

        // update the network
clk = Abc_Clock();
        RetValue = Lpk_ExploreCut( p, pCut, pDsdNtk );
p->timeEval += Abc_Clock() - clk;
        Kit_DsdNtkFree( pDsdNtk );
        if ( RetValue )
            break;
    }
    return 1;
}